

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClausesBuffer.cc
# Opt level: O2

bool __thiscall Glucose::ClausesBuffer::pushClause(ClausesBuffer *this,int threadId,Clause *c)

{
  bool bVar1;
  uint32_t uVar2;
  int i;
  long lVar3;
  
  if ((this->whenFullRemoveOlder == false) &&
     (this->maxsize <= this->queuesize + *(int *)&(c->header).field_0x4 + 3)) {
    bVar1 = false;
  }
  else {
    while (uVar2 = *(uint32_t *)&(c->header).field_0x4, this->maxsize <= this->queuesize + uVar2 + 3
          ) {
      this->forcedRemovedClauses = this->forcedRemovedClauses + 1;
      removeLastClause(this);
    }
    noCheckPush(this,uVar2);
    uVar2 = 1;
    if (1 < this->nbThreads) {
      uVar2 = this->nbThreads - 1;
    }
    noCheckPush(this,uVar2);
    noCheckPush(this,threadId);
    for (lVar3 = 0; lVar3 < *(long *)&c->header >> 0x20; lVar3 = lVar3 + 1) {
      noCheckPush(this,*(uint32_t *)(&c[1].header.field_0x0 + lVar3 * 4));
    }
    this->queuesize = (int)((ulong)*(long *)&c->header >> 0x20) + this->queuesize + 3;
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool ClausesBuffer::pushClause(int threadId, Clause & c) {
    if (!whenFullRemoveOlder && (queuesize + c.size() + headerSize >= maxsize))
	return false; // We need to remove some old clauses
    while (queuesize + c.size() + headerSize >= maxsize) { // We need to remove some old clauses
	forcedRemovedClauses ++;
	removeLastClause();
	assert(queuesize > 0);
    }
    noCheckPush(c.size());
    noCheckPush(nbThreads>1?nbThreads-1:1);
    noCheckPush(threadId);
    for(int i=0;i<c.size();i++)
	noCheckPush(toInt(c[i]));
    queuesize += c.size()+headerSize;
    return true;
    //  printf(" -> (%d, %d)\n", first, last);
}